

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<11>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  ArrayOutput *output_00;
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < *(int *)((long)field + 8); lVar1 = lVar1 + 1) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    output_00 = (ArrayOutput *)(*(long *)((long)field + 0x10) + 8);
    if (*(long *)((long)field + 0x10) == 0) {
      output_00 = (ArrayOutput *)0x0;
    }
    SerializeMessageTo<google::protobuf::internal::ArrayOutput>
              ((internal *)(&output_00->ptr)[lVar1],(MessageLite *)md->ptr,output,output_00);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeMessageTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          md.ptr, output);
    }
  }